

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

void rhash_sha512_init(sha512_ctx *ctx)

{
  ctx->length = 0;
  ctx->digest_length = 0x40;
  ctx->hash[0] = 0x6a09e667f3bcc908;
  ctx->hash[1] = 0xbb67ae8584caa73b;
  ctx->hash[2] = 0x3c6ef372fe94f82b;
  ctx->hash[3] = 0xa54ff53a5f1d36f1;
  ctx->hash[4] = 0x510e527fade682d1;
  ctx->hash[5] = 0x9b05688c2b3e6c1f;
  ctx->hash[6] = 0x1f83d9abfb41bd6b;
  ctx->hash[7] = 0x5be0cd19137e2179;
  return;
}

Assistant:

void rhash_sha512_init(sha512_ctx* ctx)
{
	/* Initial values. These words were obtained by taking the first 32
	 * bits of the fractional parts of the square roots of the first
	 * eight prime numbers. */
	static const uint64_t SHA512_H0[8] = {
		I64(0x6a09e667f3bcc908), I64(0xbb67ae8584caa73b), I64(0x3c6ef372fe94f82b),
		I64(0xa54ff53a5f1d36f1), I64(0x510e527fade682d1), I64(0x9b05688c2b3e6c1f),
		I64(0x1f83d9abfb41bd6b), I64(0x5be0cd19137e2179)
	};

	ctx->length = 0;
	ctx->digest_length = sha512_hash_size;

	/* initialize algorithm state */
	memcpy(ctx->hash, SHA512_H0, sizeof(ctx->hash));
}